

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<double>::MergeFrom
          (RepeatedField<double> *this,RepeatedField<double> *other)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  double *__src;
  bool is_soo;
  
  if (other == this) {
    MergeFrom();
  }
  uVar1 = (other->soo_rep_).field_0.long_rep.elements_int;
  iVar3 = internal::SooRep::size(&other->soo_rep_,(uVar1 & 4) == 0);
  if (iVar3 != 0) {
    iVar4 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    iVar4 = iVar4 + iVar3;
    Reserve(this,iVar4);
    uVar2 = (this->soo_rep_).field_0.long_rep.elements_int;
    is_soo = (uVar2 & 4) == 0;
    pdVar6 = elements(this,is_soo);
    iVar5 = internal::SooRep::size(&this->soo_rep_,is_soo);
    if ((iVar5 != iVar4) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar2 & 4) == 0,iVar4);
    __src = elements(other,(uVar1 & 4) == 0);
    memcpy(pdVar6 + iVar5,__src,(long)iVar3 << 3);
    return;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  ABSL_DCHECK_NE(&other, this);
  const bool other_is_soo = other.is_soo();
  if (auto other_size = other.size(other_is_soo)) {
    const int old_size = size();
    Reserve(old_size + other_size);
    const bool is_soo = this->is_soo();
    Element* dst =
        elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + other_size);
    UninitializedCopyN(other.elements(other_is_soo), other_size, dst);
  }
}